

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::from_hex_to_i(string *s,size_t i,size_t cnt,int *val)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  int *in_RCX;
  long in_RDX;
  int *in_RSI;
  ulong in_RDI;
  int v;
  int iVar4;
  long local_20;
  bool local_1;
  
  piVar2 = (int *)std::__cxx11::string::size();
  if (in_RSI < piVar2) {
    *in_RCX = 0;
    for (local_20 = in_RDX; local_20 != 0; local_20 = local_20 + -1) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (*pcVar3 == '\0') {
        return false;
      }
      iVar4 = 0;
      std::__cxx11::string::operator[](in_RDI);
      bVar1 = is_hex((char)((uint)iVar4 >> 0x10),in_RSI);
      if (!bVar1) {
        return false;
      }
      *in_RCX = *in_RCX * 0x10 + iVar4;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool from_hex_to_i(const std::string &s, size_t i, size_t cnt,
                          int &val) {
  if (i >= s.size()) { return false; }

  val = 0;
  for (; cnt; i++, cnt--) {
    if (!s[i]) { return false; }
    auto v = 0;
    if (is_hex(s[i], v)) {
      val = val * 16 + v;
    } else {
      return false;
    }
  }
  return true;
}